

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,mbedtls_mpi *tmp
                  )

{
  int iVar1;
  int local_2c;
  int ret;
  mbedtls_mpi *tmp_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = mbedtls_ecp_group_a_is_minus_3(grp);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 1,&P->X,&P->X);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_int_mod(grp,tmp,tmp + 1,3);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_cmp_int(&grp->A,0);
    if (iVar1 == 0) goto LAB_0038ac16;
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 1,&P->Z,&P->Z);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 2,tmp + 1,tmp + 1);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 1,tmp + 2,&grp->A);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_add_mod(grp,tmp,tmp,tmp + 1);
  }
  else {
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 1,&P->Z,&P->Z);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_add_mod(grp,tmp + 2,&P->X,tmp + 1);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_sub_mod(grp,tmp + 3,&P->X,tmp + 1);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 1,tmp + 2,tmp + 3);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_int_mod(grp,tmp,tmp + 1,3);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_0038ac16:
  local_2c = mbedtls_mpi_mul_mod(grp,tmp + 2,&P->Y,&P->Y);
  if (((((local_2c == 0) && (local_2c = mbedtls_mpi_shift_l_mod(grp,tmp + 2,1), local_2c == 0)) &&
       (local_2c = mbedtls_mpi_mul_mod(grp,tmp + 1,&P->X,tmp + 2), local_2c == 0)) &&
      (((local_2c = mbedtls_mpi_shift_l_mod(grp,tmp + 1,1), local_2c == 0 &&
        (local_2c = mbedtls_mpi_mul_mod(grp,tmp + 3,tmp + 2,tmp + 2), local_2c == 0)) &&
       ((local_2c = mbedtls_mpi_shift_l_mod(grp,tmp + 3,1), local_2c == 0 &&
        ((local_2c = mbedtls_mpi_mul_mod(grp,tmp + 2,tmp,tmp), local_2c == 0 &&
         (local_2c = mbedtls_mpi_sub_mod(grp,tmp + 2,tmp + 2,tmp + 1), local_2c == 0)))))))) &&
     ((local_2c = mbedtls_mpi_sub_mod(grp,tmp + 2,tmp + 2,tmp + 1), local_2c == 0 &&
      (((((local_2c = mbedtls_mpi_sub_mod(grp,tmp + 1,tmp + 1,tmp + 2), local_2c == 0 &&
          (local_2c = mbedtls_mpi_mul_mod(grp,tmp + 1,tmp + 1,tmp), local_2c == 0)) &&
         (local_2c = mbedtls_mpi_sub_mod(grp,tmp + 1,tmp + 1,tmp + 3), local_2c == 0)) &&
        ((local_2c = mbedtls_mpi_mul_mod(grp,tmp + 3,&P->Y,&P->Z), local_2c == 0 &&
         (local_2c = mbedtls_mpi_shift_l_mod(grp,tmp + 3,1), local_2c == 0)))) &&
       ((local_2c = mbedtls_mpi_copy(&R->X,tmp + 2), local_2c == 0 &&
        (local_2c = mbedtls_mpi_copy(&R->Y,tmp + 1), local_2c == 0)))))))) {
    local_2c = mbedtls_mpi_copy(&R->Z,tmp + 3);
  }
  return local_2c;
}

Assistant:

static int ecp_double_jac(const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P,
                          mbedtls_mpi tmp[4])
{
#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

#if defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_double_jac(grp, R, P);
    }
#endif /* MBEDTLS_ECP_DOUBLE_JAC_ALT */

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Special case for A = -3 */
    if (mbedtls_ecp_group_a_is_minus_3(grp)) {
        /* tmp[0] <- M = 3(X + Z^2)(X - Z^2) */
        MPI_ECP_SQR(&tmp[1],  &P->Z);
        MPI_ECP_ADD(&tmp[2],  &P->X,  &tmp[1]);
        MPI_ECP_SUB(&tmp[3],  &P->X,  &tmp[1]);
        MPI_ECP_MUL(&tmp[1],  &tmp[2],     &tmp[3]);
        MPI_ECP_MUL_INT(&tmp[0],  &tmp[1],     3);
    } else {
        /* tmp[0] <- M = 3.X^2 + A.Z^4 */
        MPI_ECP_SQR(&tmp[1],  &P->X);
        MPI_ECP_MUL_INT(&tmp[0],  &tmp[1],  3);

        /* Optimize away for "koblitz" curves with A = 0 */
        if (MPI_ECP_CMP_INT(&grp->A, 0) != 0) {
            /* M += A.Z^4 */
            MPI_ECP_SQR(&tmp[1],  &P->Z);
            MPI_ECP_SQR(&tmp[2],  &tmp[1]);
            MPI_ECP_MUL(&tmp[1],  &tmp[2],     &grp->A);
            MPI_ECP_ADD(&tmp[0],  &tmp[0],     &tmp[1]);
        }
    }

    /* tmp[1] <- S = 4.X.Y^2 */
    MPI_ECP_SQR(&tmp[2],  &P->Y);
    MPI_ECP_SHIFT_L(&tmp[2],  1);
    MPI_ECP_MUL(&tmp[1],  &P->X, &tmp[2]);
    MPI_ECP_SHIFT_L(&tmp[1],  1);

    /* tmp[3] <- U = 8.Y^4 */
    MPI_ECP_SQR(&tmp[3],  &tmp[2]);
    MPI_ECP_SHIFT_L(&tmp[3],  1);

    /* tmp[2] <- T = M^2 - 2.S */
    MPI_ECP_SQR(&tmp[2],  &tmp[0]);
    MPI_ECP_SUB(&tmp[2],  &tmp[2], &tmp[1]);
    MPI_ECP_SUB(&tmp[2],  &tmp[2], &tmp[1]);

    /* tmp[1] <- S = M(S - T) - U */
    MPI_ECP_SUB(&tmp[1],  &tmp[1],     &tmp[2]);
    MPI_ECP_MUL(&tmp[1],  &tmp[1],     &tmp[0]);
    MPI_ECP_SUB(&tmp[1],  &tmp[1],     &tmp[3]);

    /* tmp[3] <- U = 2.Y.Z */
    MPI_ECP_MUL(&tmp[3],  &P->Y,  &P->Z);
    MPI_ECP_SHIFT_L(&tmp[3],  1);

    /* Store results */
    MPI_ECP_MOV(&R->X, &tmp[2]);
    MPI_ECP_MOV(&R->Y, &tmp[1]);
    MPI_ECP_MOV(&R->Z, &tmp[3]);

cleanup:

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_DOUBLE_JAC_ALT) */
}